

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_oram.h
# Opt level: O0

void __thiscall CircuitOram::flush(CircuitOram *this,int path)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bucket<int> *this_00;
  reference ppBVar5;
  reference piVar6;
  reference pvVar7;
  int in_ESI;
  TreeOram *in_RDI;
  int i_3;
  int to_write;
  int hold;
  bool has_empty;
  int i_2;
  int dest;
  int l;
  int i_1;
  int d;
  int v;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int i;
  int goal;
  int src;
  vector<int,_std::allocator<int>_> target;
  vector<int,_std::allocator<int>_> deepest;
  vector<int,_std::allocator<int>_> deepest_depth;
  vector<int,_std::allocator<int>_> deepest_index;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  value_type in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e0;
  value_type local_dc;
  int local_d4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  value_type local_b8;
  int local_ac;
  value_type local_a8;
  value_type local_a4;
  undefined4 local_9c;
  vector<int,_std::allocator<int>_> local_98;
  undefined4 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  undefined4 local_5c;
  vector<int,_std::allocator<int>_> local_58;
  undefined4 local_2c;
  vector<int,_std::allocator<int>_> local_28;
  int local_c;
  
  local_2c = 0xffffffff;
  local_c = in_ESI;
  std::allocator<int>::allocator((allocator<int> *)0x10c64f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (value_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::allocator<int>::~allocator((allocator<int> *)0x10c67d);
  local_5c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x10c6ae);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (value_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::allocator<int>::~allocator((allocator<int> *)0x10c6dc);
  local_7c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x10c70d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (value_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::allocator<int>::~allocator((allocator<int> *)0x10c73b);
  this_00 = (Bucket<int> *)(long)(in_RDI->logN + 1);
  local_9c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x10c76c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (value_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::allocator<int>::~allocator((allocator<int> *)0x10c79a);
  local_a4 = -1;
  local_a8 = -1;
  for (local_ac = 0; local_ac <= in_RDI->h; local_ac = local_ac + 1) {
    iVar2 = TreeOram::bucketAt(in_RDI,local_c,local_ac);
    ppBVar5 = std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::operator[]
                        (&in_RDI->tree,(long)iVar2);
    local_b8 = *ppBVar5;
    local_c0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffe98);
    std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffe98), bVar1) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_c0);
      iVar2 = *piVar6;
      if (iVar2 != -1) {
        iVar4 = local_c;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)iVar2);
        iVar3 = TreeOram::push_distance(in_RDI,iVar4,*pvVar7);
        iVar4 = iVar3;
        in_stack_fffffffffffffec4 = iVar3;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_ac);
        if (*pvVar7 < iVar4) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_ac);
          *pvVar7 = iVar2;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_ac);
          *pvVar7 = iVar3;
          in_stack_fffffffffffffeb4 = iVar2;
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_c0);
    }
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
  if (*pvVar7 != -1) {
    local_a4 = 0;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,0);
    local_a8 = *pvVar7;
  }
  for (local_d4 = 1; local_d4 <= in_RDI->h; local_d4 = local_d4 + 1) {
    if (local_d4 <= local_a8) {
      in_stack_fffffffffffffeb0 = local_a4;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_d4);
      *pvVar7 = in_stack_fffffffffffffeb0;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_d4);
    if (local_a8 < *pvVar7) {
      local_a4 = local_d4;
      local_a8 = *pvVar7;
    }
  }
  local_dc = -1;
  local_a4 = -1;
  for (local_e0 = in_RDI->h; -1 < local_e0; local_e0 = local_e0 + -1) {
    if (local_e0 == local_a4) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_e0);
      *pvVar7 = local_dc;
      local_dc = -1;
      local_a4 = -1;
    }
    iVar2 = TreeOram::bucketAt(in_RDI,local_c,local_e0);
    ppBVar5 = std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::operator[]
                        (&in_RDI->tree,(long)iVar2);
    iVar2 = Bucket<int>::size(*ppBVar5);
    iVar4 = TreeOram::bucketAt(in_RDI,local_c,local_e0);
    std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::operator[]
              (&in_RDI->tree,(long)iVar4);
    iVar4 = Bucket<int>::capacity((Bucket<int> *)0x10cbf5);
    if ((((local_dc == -1) && (iVar2 < iVar4)) ||
        (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_e0),
        *pvVar7 != -1)) &&
       (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_e0),
       *pvVar7 != -1)) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_e0);
      local_a4 = *pvVar7;
      local_dc = local_e0;
    }
  }
  local_dc = -1;
  local_e8 = -1;
  for (local_f0 = 0; local_f0 <= in_RDI->h; local_f0 = local_f0 + 1) {
    local_ec = -1;
    if ((local_e8 != -1) && (local_f0 == local_dc)) {
      local_ec = local_e8;
      local_e8 = -1;
      local_dc = -1;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_f0);
    if (*pvVar7 != -1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_f0);
      local_e8 = *pvVar7;
      iVar2 = TreeOram::bucketAt(in_RDI,local_c,local_f0);
      std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::operator[]
                (&in_RDI->tree,(long)iVar2);
      std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_f0);
      Bucket<int>::readAndRemove(this_00,in_stack_fffffffffffffec4);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_f0);
      local_dc = *pvVar7;
    }
    if (local_ec != -1) {
      iVar2 = TreeOram::bucketAt(in_RDI,local_c,local_f0);
      std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::operator[]
                (&in_RDI->tree,(long)iVar2);
      Bucket<int>::add(this_00,in_stack_fffffffffffffec4);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

void flush(int path)
      {
         vector<int> deepest_index(logN+1, -1);
         vector<int> deepest_depth(logN+1, -1);
         vector<int> deepest(logN+1, -1);
         vector<int> target(logN+1, -1);
         int src = -1, goal = -1;
         for(int i = 0; i <= h; ++i) {
            for(auto v : tree[bucketAt(path, i)]->blocks) {
               if(v!=-1) {
                  int d = push_distance(path, index[v]);
                  if(d > deepest_depth[i]) {
                     deepest_index[i] = v;
                     deepest_depth[i] = d;
                  }
               }
            }
         }

         if(deepest_index[0] != -1) {
            src = 0;
            goal = deepest_depth[0];
         }

         for(int  i = 1; i <=h; ++i) {
            if(goal >= i)
               deepest[i] = src;
            int l = deepest_depth[i];
            if(l > goal) {
               goal = l;
               src = i;
            }
         }

         int dest = -1; src = -1;
         for(int  i = h; i >= 0; --i) {
            if(i == src) {
               target[i] = dest;
               dest = -1;
               src = -1;
            }
            bool has_empty = tree[bucketAt(path, i)]->size() < tree[bucketAt(path, i)]->capacity();
            if( ( (dest == -1 and has_empty) or target[i]!=-1 ) and deepest[i]!=-1) {
               src = deepest[i];
               dest = i;
            }
         }
         dest = -1;
         int hold = -1;
         int to_write = -1;
         for(int i = 0; i <= h; ++i) {
            to_write = -1;
            if(hold != -1 and i == dest) {
               to_write = hold;
               hold = -1;
               dest = -1;
            }
            if(target[i]!=-1) {
               hold = deepest_index[i];
               tree[bucketAt(path, i)]->readAndRemove(deepest_index[i]);
               dest = target[i];
            }
            if(to_write != -1)
               tree[bucketAt(path, i)]->add(to_write);
         }
      }